

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# async.c++
# Opt level: O3

void __thiscall kj::_::FiberStack::initialize(FiberStack *this,SynchronousFunc *func)

{
  Fault f;
  DebugComparison<kj::OneOf<kj::_::FiberBase_*,_kj::_::FiberStack::SynchronousFunc_*>_&,_std::nullptr_t>
  _kjCondition;
  Fault local_38;
  DebugComparison<kj::OneOf<kj::_::FiberBase_*,_kj::_::FiberStack::SynchronousFunc_*>_&,_std::nullptr_t>
  local_30;
  
  local_30.left = &this->main;
  local_30.result = (this->main).tag == 0;
  local_30.right = (void *)0x0;
  local_30.op.content.ptr = " == ";
  local_30.op.content.size_ = 5;
  if (local_30.result) {
    (this->main).tag = 2;
    (this->main).field_1 =
         (anon_union_8_1_a8a2e026_for_OneOf<kj::_::FiberBase_*,_kj::_::FiberStack::SynchronousFunc_*>_2
          )func;
    return;
  }
  Debug::Fault::
  Fault<kj::Exception::Type,kj::_::DebugComparison<kj::OneOf<kj::_::FiberBase*,kj::_::FiberStack::SynchronousFunc*>&,decltype(nullptr)>&>
            (&local_38,
             "/workspace/llm4binary/github/license_c_cmakelists/capnproto[P]capnproto/c++/src/kj/async.c++"
             ,0x63c,FAILED,"this->main == nullptr","_kjCondition,",&local_30);
  Debug::Fault::fatal(&local_38);
}

Assistant:

void FiberStack::initialize(SynchronousFunc& func) {
  KJ_REQUIRE(this->main == nullptr);
  this->main = &func;
}